

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_CMP(Context *ctx)

{
  int iVar1;
  int iVar2;
  RegisterType RVar3;
  byte bVar4;
  long lVar5;
  
  iVar1 = ctx->cmps;
  ctx->cmps = iVar1 + 1;
  bVar4 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar4 = ctx->minor_ver;
  }
  if (((uint)bVar4 | (uint)ctx->major_ver << 0x10) < 0x10004) {
    iVar2 = (ctx->dest_arg).regnum;
    RVar3 = (ctx->dest_arg).regtype;
    if (2 < iVar1) {
      failf(ctx,"%s","only 3 CMP instructions allowed in this shader model");
    }
    lVar5 = 0x168;
    do {
      if ((RVar3 == *(RegisterType *)((long)&ctx->malloc_data + lVar5 + 4)) &&
         (iVar2 == *(int *)((long)&ctx->isfail + lVar5))) {
        failf(ctx,"%s","CMP dest can\'t match sources in this shader model");
      }
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x228);
    ctx->instruction_count = ctx->instruction_count + 1;
  }
  return;
}

Assistant:

static void state_CMP(Context *ctx)
{
    ctx->cmps++;

    // extra limitations for ps <= 1.4 ...
    if (!shader_version_atleast(ctx, 1, 4))
    {
        int i;
        const DestArgInfo *dst = &ctx->dest_arg;
        const RegisterType dregtype = dst->regtype;
        const int dregnum = dst->regnum;

        if (ctx->cmps > 3)
            fail(ctx, "only 3 CMP instructions allowed in this shader model");

        for (i = 0; i < 3; i++)
        {
            const SourceArgInfo *src = &ctx->source_args[i];
            const RegisterType sregtype = src->regtype;
            const int sregnum = src->regnum;
            if ((dregtype == sregtype) && (dregnum == sregnum))
                fail(ctx, "CMP dest can't match sources in this shader model");
        } // for

        ctx->instruction_count++;  // takes an extra slot in ps_1_2 and _3.
    } // if
}